

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

SUNMatrix SUNBandMatrixStorage
                    (sunindextype N,sunindextype mu,sunindextype ml,sunindextype smu,
                    SUNContext_conflict sunctx)

{
  SUNMatrix_Ops p_Var1;
  SUNMatrix p_Var2;
  sunindextype *psVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  size_t __nmemb;
  
  p_Var2 = (SUNMatrix)SUNMatNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->getid = SUNMatGetID_Band;
  p_Var1->clone = SUNMatClone_Band;
  p_Var1->destroy = SUNMatDestroy_Band;
  p_Var1->zero = SUNMatZero_Band;
  p_Var1->copy = SUNMatCopy_Band;
  p_Var1->scaleadd = SUNMatScaleAdd_Band;
  p_Var1->scaleaddi = SUNMatScaleAddI_Band;
  p_Var1->matvec = SUNMatMatvec_Band;
  p_Var1->space = SUNMatSpace_Band;
  psVar3 = (sunindextype *)malloc(0x48);
  p_Var2->content = psVar3;
  lVar6 = smu + ml + 1;
  *psVar3 = N;
  psVar3[1] = N;
  psVar3[3] = mu;
  psVar3[4] = ml;
  psVar3[5] = smu;
  psVar3[2] = lVar6;
  __nmemb = lVar6 * N;
  psVar3[7] = __nmemb;
  pvVar4 = calloc(__nmemb,8);
  psVar3[6] = (sunindextype)pvVar4;
  pvVar4 = malloc(N * 8);
  psVar3[8] = (sunindextype)pvVar4;
  lVar6 = 0;
  if (N < 1) {
    N = lVar6;
  }
  for (lVar5 = 0; N != lVar5; lVar5 = lVar5 + 1) {
    *(sunindextype *)(psVar3[8] + lVar5 * 8) = psVar3[6] + lVar6;
    lVar6 = lVar6 + (smu + ml) * 8 + 8;
  }
  return p_Var2;
}

Assistant:

SUNMatrix SUNBandMatrixStorage(sunindextype N, sunindextype mu, sunindextype ml,
                               sunindextype smu, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNMatrix A;
  SUNMatrixContent_Band content;
  sunindextype j, colSize;

  SUNAssertNull(N > 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(smu >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(ml >= 0, SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Band;
  A->ops->clone     = SUNMatClone_Band;
  A->ops->destroy   = SUNMatDestroy_Band;
  A->ops->zero      = SUNMatZero_Band;
  A->ops->copy      = SUNMatCopy_Band;
  A->ops->scaleadd  = SUNMatScaleAdd_Band;
  A->ops->scaleaddi = SUNMatScaleAddI_Band;
  A->ops->matvec    = SUNMatMatvec_Band;
  A->ops->space     = SUNMatSpace_Band;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Band)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  A->content = content;

  /* Fill content */
  colSize        = smu + ml + 1;
  content->M     = N;
  content->N     = N;
  content->mu    = mu;
  content->ml    = ml;
  content->s_mu  = smu;
  content->ldim  = colSize;
  content->ldata = N * colSize;
  content->data  = NULL;
  content->cols  = NULL;

  /* Allocate content */
  content->data = (sunrealtype*)calloc(N * colSize, sizeof(sunrealtype));
  SUNAssertNull(content->data, SUN_ERR_MALLOC_FAIL);

  content->cols = (sunrealtype**)malloc(N * sizeof(sunrealtype*));
  SUNAssertNull(content->cols, SUN_ERR_MALLOC_FAIL);
  for (j = 0; j < N; j++) { content->cols[j] = content->data + j * colSize; }

  return (A);
}